

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint *puVar1;
  size_t sVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  uivector nextcode;
  uivector blcount;
  uivector local_68;
  uivector local_48;
  
  local_48.data = (uint *)0x0;
  local_48.size = 0;
  local_48.allocsize = 0;
  local_68.data = (uint *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  puVar4 = (uint *)malloc((ulong)tree->numcodes << 2);
  sVar2 = local_48.size;
  uVar6 = 0x53;
  if (puVar4 != (uint *)0x0) {
    uVar6 = 0;
  }
  tree->tree1d = puVar4;
  uVar8 = (ulong)(tree->maxbitlen + 1);
  uVar3 = uivector_resize(&local_48,uVar8);
  if (((sVar2 <= uVar8 && uVar8 - sVar2 != 0) & (byte)uVar3) == 1) {
    memset(local_48.data + sVar2,0,(uVar8 - sVar2) * 4);
  }
  sVar2 = local_68.size;
  if (uVar3 != 0) {
    uVar8 = (ulong)(tree->maxbitlen + 1);
    uVar3 = uivector_resize(&local_68,uVar8);
    if (((sVar2 <= uVar8 && uVar8 - sVar2 != 0) & (byte)uVar3) == 1) {
      memset(local_68.data + sVar2,0,(uVar8 - sVar2) * 4);
    }
    if (uVar3 != 0) goto LAB_0010f099;
  }
  uVar6 = 0x53;
LAB_0010f099:
  if (uVar6 == 0) {
    if (tree->numcodes != 0) {
      puVar4 = tree->lengths;
      uVar8 = 0;
      do {
        local_48.data[puVar4[uVar8]] = local_48.data[puVar4[uVar8]] + 1;
        uVar8 = uVar8 + 1;
      } while (uVar8 < tree->numcodes);
    }
    if (tree->maxbitlen != 0) {
      uVar6 = 1;
      do {
        local_68.data[uVar6] = (local_48.data[uVar6 - 1] + local_68.data[uVar6 - 1]) * 2;
        uVar6 = uVar6 + 1;
      } while (uVar6 <= tree->maxbitlen);
    }
    if (tree->numcodes != 0) {
      puVar4 = tree->lengths;
      uVar8 = 0;
      do {
        uVar5 = (ulong)puVar4[uVar8];
        if (uVar5 != 0) {
          uVar6 = local_68.data[uVar5];
          local_68.data[uVar5] = uVar6 + 1;
          tree->tree1d[uVar8] = uVar6;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < tree->numcodes);
    }
    local_48.size = 0;
    local_48.allocsize = 0;
    free(local_48.data);
    local_48.data = (uint *)0x0;
    local_68.size = 0;
    local_68.allocsize = 0;
    free(local_68.data);
    local_68.data = (uint *)0x0;
    uVar6 = tree->numcodes;
    uVar8 = (ulong)(uVar6 * 2);
    puVar4 = (uint *)malloc(uVar8 * 4);
    tree->tree2d = puVar4;
    if (puVar4 == (uint *)0x0) {
      uVar6 = 0x53;
    }
    else {
      if (uVar8 != 0) {
        uVar5 = 0;
        do {
          puVar4[uVar5] = 0x7fff;
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
      }
      if ((ulong)uVar6 != 0) {
        puVar1 = tree->lengths;
        uVar5 = 0;
        uVar7 = 0;
        uVar3 = 0;
        do {
          uVar12 = puVar1[uVar5];
          if (uVar12 != 0) {
            iVar11 = -1;
            uVar10 = 1;
            uVar9 = uVar7;
            do {
              uVar7 = uVar9;
              if (uVar9 <= uVar6 - 2) {
                uVar13 = (uint)((tree->tree1d[uVar5] >> (uVar12 + iVar11 & 0x1f) & 1) != 0) +
                         uVar9 * 2;
                if (puVar4[uVar13] == 0x7fff) {
                  if (uVar10 == uVar12) {
                    puVar4[uVar13] = (uint)uVar5;
                    uVar7 = 0;
                  }
                  else {
                    uVar7 = uVar3 + 1;
                    puVar4[uVar13] = uVar3 + uVar6 + 1;
                    uVar3 = uVar7;
                  }
                }
                else {
                  uVar7 = puVar4[uVar13] - uVar6;
                }
              }
              if (uVar6 - 2 < uVar9) {
                return 0x37;
              }
              uVar12 = puVar1[uVar5];
              iVar11 = iVar11 + -1;
              bVar14 = uVar10 < uVar12;
              uVar10 = uVar10 + 1;
              uVar9 = uVar7;
            } while (bVar14);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar6 * 2 == 0) {
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        uVar6 = 0;
        do {
          if (puVar4[uVar5] == 0x7fff) {
            puVar4[uVar5] = 0;
          }
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
      }
    }
  }
  else {
    local_48.size = 0;
    local_48.allocsize = 0;
    free(local_48.data);
    local_48.data = (uint *)0x0;
    local_68.size = 0;
    local_68.allocsize = 0;
    free(local_68.data);
  }
  return uVar6;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned bits, n, error = 0;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits < tree->numcodes; bits++) blcount.data[tree->lengths[bits]]++;
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; bits++)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n < tree->numcodes; n++)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}